

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::GeneratorHelpers::integerWidth
          (GeneratorHelpers *this,MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  bool bVar1;
  IntegerWidth IVar2;
  ConstChar16Ptr local_40;
  char16_t *local_38;
  anon_union_8_2_136a0349_for_fUnion local_28;
  undefined1 local_20;
  
  if ((this[0x84] == (GeneratorHelpers)0x0) && (*(short *)(this + 0x7c) != -1)) {
    IVar2 = IntegerWidth::standard();
    local_28 = IVar2.fUnion;
    local_20 = IVar2.fHasError;
    bVar1 = IntegerWidth::operator==
                      ((IntegerWidth *)(this + 0x7c),(IntegerWidth *)&local_28.minMaxInt);
    if (!bVar1) {
      local_40.p_ = L"integer-width/";
      UnicodeString::append((UnicodeString *)macros,&local_40,-1);
      local_38 = local_40.p_;
      blueprint_helpers::generateIntegerWidthOption
                ((int)*(short *)(this + 0x7c),(int)*(short *)(this + 0x7e),(UnicodeString *)macros,
                 status);
      return true;
    }
  }
  return false;
}

Assistant:

bool GeneratorHelpers::integerWidth(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.integerWidth.fHasError || macros.integerWidth.isBogus() ||
        macros.integerWidth == IntegerWidth::standard()) {
        // Error or Default
        return false;
    }
    sb.append(u"integer-width/", -1);
    blueprint_helpers::generateIntegerWidthOption(
            macros.integerWidth.fUnion.minMaxInt.fMinInt,
            macros.integerWidth.fUnion.minMaxInt.fMaxInt,
            sb,
            status);
    return true;
}